

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclCnRunner.cpp
# Opt level: O0

void __thiscall xmrig::OclCnRunner::set(OclCnRunner *this,Job *job,uint8_t *blob)

{
  bool bVar1;
  size_t sVar2;
  length_error *this_00;
  size_t sVar3;
  long in_RDX;
  Job *in_RSI;
  long in_RDI;
  CnBranchKernel *kernel;
  iterator __end1;
  iterator __begin1;
  vector<xmrig::CnBranchKernel_*,_std::allocator<xmrig::CnBranchKernel_*>_> *__range1;
  vector<xmrig::CnBranchKernel_*,_std::allocator<xmrig::CnBranchKernel_*>_>
  *in_stack_ffffffffffffff78;
  CnBranchKernel *in_stack_ffffffffffffff80;
  Cn1Kernel *this_01;
  void *in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  __normal_iterator<xmrig::CnBranchKernel_**,_std::vector<xmrig::CnBranchKernel_*,_std::allocator<xmrig::CnBranchKernel_*>_>_>
  in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  cl_bool blocking_write;
  cl_mem in_stack_ffffffffffffffd8;
  OclBaseRunner *in_stack_ffffffffffffffe0;
  
  blocking_write = (cl_bool)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  sVar2 = Job::size(in_RSI);
  if (0x7c < sVar2) {
    this_00 = (length_error *)__cxa_allocate_exception(0x10);
    std::length_error::length_error(this_00,"job size too big");
    __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
  }
  sVar2 = Job::size(in_RSI);
  *(undefined1 *)(in_RDX + sVar2) = 1;
  sVar2 = Job::size(in_RSI);
  sVar3 = Job::size(in_RSI);
  memset((void *)(in_RDX + sVar2 + 1),0,0x7f - sVar3);
  OclBaseRunner::enqueueWriteBuffer
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,blocking_write,
             (size_t)in_stack_ffffffffffffffc8._M_current,in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffb8);
  std::vector<xmrig::CnBranchKernel_*,_std::allocator<xmrig::CnBranchKernel_*>_>::begin
            (in_stack_ffffffffffffff78);
  std::vector<xmrig::CnBranchKernel_*,_std::allocator<xmrig::CnBranchKernel_*>_>::end
            (in_stack_ffffffffffffff78);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<xmrig::CnBranchKernel_**,_std::vector<xmrig::CnBranchKernel_*,_std::allocator<xmrig::CnBranchKernel_*>_>_>
                        *)in_stack_ffffffffffffff80,
                       (__normal_iterator<xmrig::CnBranchKernel_**,_std::vector<xmrig::CnBranchKernel_*,_std::allocator<xmrig::CnBranchKernel_*>_>_>
                        *)in_stack_ffffffffffffff78);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<xmrig::CnBranchKernel_**,_std::vector<xmrig::CnBranchKernel_*,_std::allocator<xmrig::CnBranchKernel_*>_>_>
    ::operator*((__normal_iterator<xmrig::CnBranchKernel_**,_std::vector<xmrig::CnBranchKernel_*,_std::allocator<xmrig::CnBranchKernel_*>_>_>
                 *)&stack0xffffffffffffffc8);
    Job::target(in_RSI);
    CnBranchKernel::setTarget(in_stack_ffffffffffffff80,(uint64_t)in_stack_ffffffffffffff78);
    __gnu_cxx::
    __normal_iterator<xmrig::CnBranchKernel_**,_std::vector<xmrig::CnBranchKernel_*,_std::allocator<xmrig::CnBranchKernel_*>_>_>
    ::operator++((__normal_iterator<xmrig::CnBranchKernel_**,_std::vector<xmrig::CnBranchKernel_*,_std::allocator<xmrig::CnBranchKernel_*>_>_>
                  *)&stack0xffffffffffffffc8);
  }
  this_01 = *(Cn1Kernel **)(in_RDI + 200);
  Job::extraIters(in_RSI);
  Cn1Kernel::setExtraIters(this_01,(uint64_t)in_stack_ffffffffffffff78);
  return;
}

Assistant:

void xmrig::OclCnRunner::set(const Job &job, uint8_t *blob)
{
    if (job.size() > (Job::kMaxBlobSize - 4)) {
        throw std::length_error("job size too big");
    }

    blob[job.size()] = 0x01;
    memset(blob + job.size() + 1, 0, Job::kMaxBlobSize - job.size() - 1);

    enqueueWriteBuffer(m_input, CL_TRUE, 0, Job::kMaxBlobSize, blob);

    for (auto kernel : m_branchKernels) {
        kernel->setTarget(job.target());
    }

    m_cn1->setExtraIters(job.extraIters());
}